

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

bool __thiscall cube::net::Socket::BindAndListen(Socket *this,InetAddr *addr,int backlog)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = bind(this->m_sockfd,(sockaddr *)addr,0x10);
  if (iVar1 < 0) {
    bVar2 = false;
  }
  else {
    iVar1 = listen(this->m_sockfd,backlog);
    bVar2 = -1 < iVar1;
  }
  return bVar2;
}

Assistant:

bool Socket::BindAndListen(const InetAddr &addr, int backlog) {
    socklen_t sockaddr_len = sizeof(addr.SockAddrIn());
    if (::bind(m_sockfd, addr.SockAddr(), sockaddr_len) < 0)
        return false;
    if (::listen(m_sockfd, backlog) < 0)
        return false;
    return true;
}